

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table.cc
# Opt level: O2

unique_ptr<void_*[],_std::default_delete<void_*[]>_> __thiscall
tcmalloc::ProduceStackTracesDump
          (tcmalloc *this,_func_StackTrace_ptr_void_ptr_ptr *next_fn,void *head)

{
  uintptr_t uVar1;
  StackTrace *pSVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  uintptr_t uVar6;
  size_t size;
  int iVar7;
  void *local_40;
  void *entry;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> *out;
  
  iVar7 = 0;
  iVar4 = 0;
  local_40 = head;
  entry = this;
  while (local_40 != (void *)0x0) {
    pSVar2 = (*next_fn)(&local_40);
    iVar4 = iVar4 + (int)pSVar2->depth;
    iVar7 = iVar7 + 3;
  }
  size = 0xffffffffffffffff;
  if (-2 < iVar4 + iVar7) {
    size = (long)(iVar4 + iVar7 + 1) << 3;
  }
  pvVar3 = operator_new__(size);
  *(void **)entry = pvVar3;
  iVar4 = 0;
  local_40 = head;
  while( true ) {
    lVar5 = (long)iVar4;
    if (local_40 == (void *)0x0) break;
    pSVar2 = (*next_fn)(&local_40);
    *(undefined8 *)((long)pvVar3 + lVar5 * 8) = 1;
    pvVar3 = *entry;
    *(uintptr_t *)((long)pvVar3 + lVar5 * 8 + 8) = pSVar2->size;
    uVar1 = pSVar2->depth;
    *(uintptr_t *)((long)pvVar3 + lVar5 * 8 + 0x10) = uVar1;
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      *(void **)((long)pvVar3 + uVar6 * 8 + (long)(iVar4 + 3) * 8) = pSVar2->stack[uVar6];
    }
    iVar4 = iVar4 + 3 + (int)uVar6;
  }
  *(undefined8 *)((long)pvVar3 + lVar5 * 8) = 0;
  return (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)
         (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)entry;
}

Assistant:

std::unique_ptr<void*[]> ProduceStackTracesDump(const StackTrace* (*next_fn)(const void** current_head),
                                                const void* head) {
  int depth_total = 0;
  int bucket_total = 0;
  for (const void* entry = head; entry != nullptr;) {
    const StackTrace* trace = next_fn(&entry);
    depth_total += trace->depth;
    bucket_total++;
  }

  int out_len = bucket_total * 3 + depth_total + 1;
  std::unique_ptr<void*[]> out{new void*[out_len]};

  int idx = 0;
  for (const void* entry = head; entry != nullptr;) {
    const StackTrace* trace = next_fn(&entry);
    out[idx++] = reinterpret_cast<void*>(uintptr_t{1});   // count
    out[idx++] = reinterpret_cast<void*>(trace->size);  // cumulative size
    out[idx++] = reinterpret_cast<void*>(trace->depth);
    for (int d = 0; d < trace->depth; ++d) {
      out[idx++] = trace->stack[d];
    }
  }
  out[idx++] = nullptr;
  ASSERT(idx == out_len);

  return out;
}